

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O3

void __thiscall
TEST_MockReturnValueTest_WhenNoPointerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
::testBody(TEST_MockReturnValueTest_WhenNoPointerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  TestTerminator *pTVar5;
  undefined4 extraout_var_00;
  SimpleString local_30;
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_30);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_20);
  uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x148))
                    ((long *)CONCAT44(extraout_var,iVar1),0x10);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x13])
            (pUVar3,0x10,uVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2ae,pTVar5);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_30);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0x1c])(pMVar2,0x10);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x13])
            (pUVar3,0x10,CONCAT44(extraout_var_00,iVar1),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2af,pTVar5);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenNoPointerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue)
{
    void * default_return_value = (void*) 0x10;
    mock().expectOneCall("foo");
    POINTERS_EQUAL(default_return_value, mock().actualCall("foo").returnPointerValueOrDefault(default_return_value));
    POINTERS_EQUAL(default_return_value, mock().returnPointerValueOrDefault(default_return_value));
}